

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O0

int __thiscall jhu::thrax::PhrasalRule::ntIndex(PhrasalRule *this,NT *needle)

{
  bool bVar1;
  const_iterator pvVar2;
  value_type *nt;
  const_iterator __end2;
  const_iterator __begin2;
  Rhs *__range2;
  int i;
  NT *needle_local;
  PhrasalRule *this_local;
  
  __range2._4_4_ = 1;
  __end2 = std::array<jhu::thrax::NT,_4UL>::begin(&this->nts);
  pvVar2 = std::array<jhu::thrax::NT,_4UL>::end(&this->nts);
  while( true ) {
    if (__end2 == pvVar2) {
      return 0;
    }
    bVar1 = SpanPair::operator==(&__end2->span,needle->span);
    if (bVar1) break;
    __range2._4_4_ = __range2._4_4_ + 1;
    __end2 = __end2 + 1;
  }
  return __range2._4_4_;
}

Assistant:

int ntIndex(const NT& needle) const {
    int i = 1;
    for (const auto& nt : nts) {
      if (nt.span == needle.span) {
        return i;
      } else {
        i++;
      }
    }
    return 0;
  }